

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_kd_tree_encoder.cc
# Opt level: O0

bool __thiscall
draco::PointCloudKdTreeEncoder::GenerateAttributesEncoder
          (PointCloudKdTreeEncoder *this,int32_t att_id)

{
  int iVar1;
  KdTreeAttributesEncoder *this_00;
  undefined8 in_RDI;
  undefined8 in_stack_ffffffffffffffb8;
  int i;
  pointer __p;
  PointCloudEncoder *in_stack_ffffffffffffffc0;
  int32_t id;
  AttributesEncoder *in_stack_ffffffffffffffd0;
  
  id = (int32_t)((ulong)in_RDI >> 0x20);
  i = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  iVar1 = PointCloudEncoder::num_attributes_encoders((PointCloudEncoder *)0x1b006c);
  if (iVar1 == 0) {
    this_00 = (KdTreeAttributesEncoder *)operator_new(0x98);
    KdTreeAttributesEncoder::KdTreeAttributesEncoder(this_00,i);
    __p = (pointer)&stack0xffffffffffffffe0;
    std::unique_ptr<draco::AttributesEncoder,std::default_delete<draco::AttributesEncoder>>::
    unique_ptr<std::default_delete<draco::AttributesEncoder>,void>
              ((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                *)this_00,__p);
    PointCloudEncoder::AddAttributesEncoder
              ((PointCloudEncoder *)this_00,
               (unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                *)__p);
    std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>::
    ~unique_ptr((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                 *)in_stack_ffffffffffffffd0);
  }
  else {
    PointCloudEncoder::attributes_encoder(in_stack_ffffffffffffffc0,i);
    AttributesEncoder::AddAttributeId(in_stack_ffffffffffffffd0,id);
  }
  return true;
}

Assistant:

bool PointCloudKdTreeEncoder::GenerateAttributesEncoder(int32_t att_id) {
  if (num_attributes_encoders() == 0) {
    // Create a new attribute encoder only for the first attribute.
    AddAttributesEncoder(std::unique_ptr<AttributesEncoder>(
        new KdTreeAttributesEncoder(att_id)));
    return true;
  }
  // Add a new attribute to the attribute encoder.
  attributes_encoder(0)->AddAttributeId(att_id);
  return true;
}